

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorTemplateBase<std::pair<unsigned_long,_llvm::DILineInfo>,_false>::grow
          (SmallVectorTemplateBase<std::pair<unsigned_long,_llvm::DILineInfo>,_false> *this,
          size_t MinSize)

{
  SmallVectorTemplateBase<std::pair<unsigned_long,_llvm::DILineInfo>,_false> *__ptr;
  ulong uVar1;
  pair<unsigned_long,_llvm::DILineInfo> *ppVar2;
  ulong uVar3;
  pair<unsigned_long,_llvm::DILineInfo> *this_00;
  long lVar4;
  pair<unsigned_long,_llvm::DILineInfo> *ppVar5;
  
  if (MinSize >> 0x20 != 0) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  uVar1 = (ulong)(this->
                 super_SmallVectorTemplateCommon<std::pair<unsigned_long,_llvm::DILineInfo>,_void>).
                 super_SmallVectorBase.Capacity + 2;
  uVar3 = uVar1 >> 1 | uVar1;
  uVar3 = uVar3 >> 2 | uVar3;
  uVar3 = uVar3 >> 4 | uVar3;
  uVar3 = uVar3 >> 8 | uVar3;
  uVar1 = (uVar1 >> 0x20 | uVar3 >> 0x10 | uVar3) + 1;
  if (uVar1 <= MinSize) {
    uVar1 = MinSize;
  }
  if (0xfffffffe < uVar1) {
    uVar1 = 0xffffffff;
  }
  ppVar2 = (pair<unsigned_long,_llvm::DILineInfo> *)malloc(uVar1 * 0x70);
  if (ppVar2 == (pair<unsigned_long,_llvm::DILineInfo> *)0x0) {
    report_bad_alloc_error("Allocation failed",true);
  }
  uVar3 = (ulong)(this->
                 super_SmallVectorTemplateCommon<std::pair<unsigned_long,_llvm::DILineInfo>,_void>).
                 super_SmallVectorBase.Size;
  if (uVar3 != 0) {
    ppVar5 = (pair<unsigned_long,_llvm::DILineInfo> *)
             (this->
             super_SmallVectorTemplateCommon<std::pair<unsigned_long,_llvm::DILineInfo>,_void>).
             super_SmallVectorBase.BeginX;
    lVar4 = uVar3 * 0x70;
    this_00 = ppVar2;
    do {
      std::pair<unsigned_long,_llvm::DILineInfo>::pair(this_00,ppVar5);
      ppVar5 = ppVar5 + 1;
      this_00 = this_00 + 1;
      lVar4 = lVar4 + -0x70;
    } while (lVar4 != 0);
  }
  ppVar5 = (pair<unsigned_long,_llvm::DILineInfo> *)
           (this->super_SmallVectorTemplateCommon<std::pair<unsigned_long,_llvm::DILineInfo>,_void>)
           .super_SmallVectorBase.BeginX;
  destroy_range(ppVar5,ppVar5 + (this->
                                super_SmallVectorTemplateCommon<std::pair<unsigned_long,_llvm::DILineInfo>,_void>
                                ).super_SmallVectorBase.Size);
  __ptr = (SmallVectorTemplateBase<std::pair<unsigned_long,_llvm::DILineInfo>,_false> *)
          (this->super_SmallVectorTemplateCommon<std::pair<unsigned_long,_llvm::DILineInfo>,_void>).
          super_SmallVectorBase.BeginX;
  if (__ptr != this + 1) {
    free(__ptr);
  }
  (this->super_SmallVectorTemplateCommon<std::pair<unsigned_long,_llvm::DILineInfo>,_void>).
  super_SmallVectorBase.BeginX = ppVar2;
  (this->super_SmallVectorTemplateCommon<std::pair<unsigned_long,_llvm::DILineInfo>,_void>).
  super_SmallVectorBase.Capacity = (uint)uVar1;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, TriviallyCopyable>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}